

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O2

void __thiscall
geometrycentral::MarkedDisjointSets::merge(MarkedDisjointSets *this,size_t x,size_t y)

{
  pointer puVar1;
  size_t sVar2;
  size_t __n;
  size_t __n_00;
  vector<bool,_std::allocator<bool>_> *this_00;
  size_t sVar3;
  reference rVar4;
  
  __n = find(this,x);
  __n_00 = find(this,y);
  puVar1 = (this->rank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = __n_00;
  sVar2 = __n;
  if (puVar1[__n_00] < puVar1[__n]) {
    sVar3 = __n;
    sVar2 = __n_00;
  }
  (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar2] = sVar3;
  if (puVar1[__n] == puVar1[__n_00]) {
    puVar1[__n_00] = puVar1[__n] + 1;
  }
  this_00 = &this->marked;
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
  if (((*rVar4._M_p & rVar4._M_mask) != 0) ||
     (rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n_00),
     (*rVar4._M_p & rVar4._M_mask) != 0)) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
    *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n_00);
    *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  }
  return;
}

Assistant:

void MarkedDisjointSets::merge(size_t x, size_t y) {
  x = find(x);
  y = find(y);

  // Smaller tree becomes a subtree of the larger tree
  if (rank[x] > rank[y])
    parent[y] = x;
  else
    parent[x] = y;

  if (rank[x] == rank[y]) rank[y]++;

  // If either was marked, both are marked
  if (marked[x] || marked[y]) {
    marked[x] = true;
    marked[y] = true;
  }
}